

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hpp
# Opt level: O0

ostream * bal::operator<<(ostream *stream,literal_t *value)

{
  bool bVar1;
  variableid_t vVar2;
  void *this;
  char *local_30;
  literal_t *value_local;
  ostream *stream_local;
  
  bVar1 = literal_t::is_variable(value);
  if (bVar1) {
    bVar1 = literal_t::is_negation(value);
    if (bVar1) {
      std::operator<<(stream,"-");
    }
    this = (void *)std::ostream::operator<<(stream,std::dec);
    vVar2 = literal_t::variable_id(value);
    std::ostream::operator<<(this,vVar2 + 1);
  }
  else {
    bVar1 = literal_t::is_unassigned(value);
    if (bVar1) {
      std::operator<<(stream,"*");
    }
    else {
      bVar1 = literal_t::is_constant_1(value);
      if (bVar1) {
        local_30 = "0b1";
      }
      else {
        local_30 = "0b0";
      }
      std::operator<<(stream,local_30);
    }
  }
  return stream;
}

Assistant:

std::ostream& operator << (std::ostream& stream, const literal_t& value) {
            if (value.is_variable()) {
                if (value.is_negation()) {
                    stream << "-";
                };
                stream << std::dec << (value.variable_id() + 1);
            } else if (value.is_unassigned()) {
                stream << "*";
            } else {
                stream << (value.is_constant_1() ? "0b1" : "0b0");
            };
            return stream;
        }